

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_affine.h
# Opt level: O0

longdouble * __thiscall
mp::LinTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (LinTerms *this,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  longdouble *plVar2;
  double *pdVar3;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this_00;
  LinTerms *in_RSI;
  double dVar4;
  size_t i;
  longdouble s;
  int in_stack_fffffffffffffefc;
  LinTerms *in_stack_ffffffffffffff18;
  ArrayRef<int> local_b8;
  ArrayRef<double> local_80;
  ArrayRef<double> local_58;
  longdouble *local_30;
  longdouble local_28;
  LinTerms *local_10;
  
  local_28 = (longdouble)0;
  local_10 = in_RSI;
  coefs(in_stack_ffffffffffffff18);
  plVar2 = (longdouble *)ArrayRef<double>::size(&local_58);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x171fe9);
  local_30 = plVar2;
  while( true ) {
    if (local_30 == (longdouble *)0x0) break;
    local_30 = (longdouble *)((long)local_30 - 1);
    coefs(in_stack_ffffffffffffff18);
    pdVar3 = ArrayRef<double>::operator[](&local_80,(size_t)local_30);
    dVar1 = *pdVar3;
    in_stack_ffffffffffffff18 = local_10;
    vars(local_10);
    this_00 = (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
              ArrayRef<int>::operator[](&local_b8,(size_t)local_30);
    dVar4 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (this_00,in_stack_fffffffffffffefc);
    local_28 = (longdouble)dVar1 * (longdouble)dVar4 + local_28;
    ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x1720c6);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x1720d3);
  }
  return local_30;
}

Assistant:

long double ComputeValue(const VarInfo& x) const {
    long double s=0.0;
    for (size_t i=coefs().size(); i--; )
      s += (long double)(coefs()[i]) * x[vars()[i]];
    return s;
  }